

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int refineBySim1_left(saucy *s,coloring *c)

{
  bool bVar1;
  int iVar2;
  Vec_Int_t *randVec_00;
  saucy_graph *__ptr;
  int nsplits;
  int allOutputsAreDistinguished;
  int j;
  int i;
  Vec_Int_t *randVec;
  saucy_graph *g;
  coloring *c_local;
  saucy *s_local;
  
  iVar2 = Abc_NtkPoNum(s->pNtk);
  if (iVar2 != 1) {
    for (allOutputsAreDistinguished = 0; allOutputsAreDistinguished < NUM_SIM1_ITERATION;
        allOutputsAreDistinguished = allOutputsAreDistinguished + 1) {
      bVar1 = true;
      for (nsplits = 0; iVar2 = Abc_NtkPoNum(s->pNtk), nsplits < iVar2; nsplits = nsplits + 1) {
        if (c->clen[nsplits] != 0) {
          bVar1 = false;
          break;
        }
      }
      if (bVar1) break;
      randVec_00 = assignRandomBitsToCells(s->pNtk,c);
      __ptr = buildSim1Graph(s->pNtk,c,randVec_00,s->iDep,s->oDep);
      if (__ptr == (saucy_graph *)0x0) {
        __assert_fail("g != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcSaucy.c"
                      ,0x506,"int refineBySim1_left(struct saucy *, struct coloring *)");
      }
      s->adj = __ptr->adj;
      s->edg = __ptr->edg;
      iVar2 = s->nsplits;
      for (nsplits = 0; nsplits < s->n; nsplits = c->clen[nsplits] + 1 + nsplits) {
        add_induce(s,c,nsplits);
      }
      refine(s,c);
      if (iVar2 < s->nsplits) {
        Vec_PtrPush(s->randomVectorArray_sim1,randVec_00);
        allOutputsAreDistinguished = 0;
        for (nsplits = 0; nsplits < s->n; nsplits = c->clen[nsplits] + 1 + nsplits) {
          add_induce(s,c,nsplits);
        }
        refineByDepGraph(s,c);
      }
      else {
        Vec_IntFree(randVec_00);
      }
      if (__ptr->adj != (int *)0x0) {
        free(__ptr->adj);
        __ptr->adj = (int *)0x0;
      }
      if (__ptr->edg != (int *)0x0) {
        free(__ptr->edg);
        __ptr->edg = (int *)0x0;
      }
      if (__ptr != (saucy_graph *)0x0) {
        free(__ptr);
      }
    }
    iVar2 = Vec_PtrSize(s->randomVectorArray_sim1);
    s->randomVectorSplit_sim1[s->lev] = iVar2;
  }
  return 1;
}

Assistant:

static int
refineBySim1_left(struct saucy *s, struct coloring *c) 
{
    struct saucy_graph *g;
    Vec_Int_t * randVec;
    int i, j;
    int allOutputsAreDistinguished;
    int nsplits;

    if (Abc_NtkPoNum(s->pNtk) == 1) return 1;
    
    for (i = 0; i < NUM_SIM1_ITERATION; i++) {

        /* if all outputs are distinguished, quit */
        allOutputsAreDistinguished = 1;
        for (j = 0; j < Abc_NtkPoNum(s->pNtk); j++) {
            if (c->clen[j]) {
                allOutputsAreDistinguished = 0;
                break;
            }
        }
        if (allOutputsAreDistinguished) break;

        randVec = assignRandomBitsToCells(s->pNtk, c);      
        g = buildSim1Graph(s->pNtk, c, randVec, s->iDep, s->oDep);
        assert(g != NULL);

        s->adj = g->adj;
        s->edg = g->edg;

        nsplits = s->nsplits;

        for (j = 0; j < s->n; j += c->clen[j]+1)            
                add_induce(s, c, j);
        refine(s, c);

        if (s->nsplits > nsplits) {
            /* save the random vector */
            Vec_PtrPush(s->randomVectorArray_sim1, randVec);            
            i = 0;  /* reset i */
            /* do more refinement by dependency graph */
            for (j = 0; j < s->n; j += c->clen[j]+1)                
                    add_induce(s, c, j);
            refineByDepGraph(s, c);
        }
        else
            Vec_IntFree(randVec);

        ABC_FREE( g->adj );
        ABC_FREE( g->edg );
        ABC_FREE( g );
    }

    s->randomVectorSplit_sim1[s->lev] = Vec_PtrSize(s->randomVectorArray_sim1); 

    return 1;
}